

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<mp::StringLiteral>::Matcher(Matcher<mp::StringLiteral> *this,StringLiteral value)

{
  EqMatcher<mp::StringLiteral> this_00;
  ExprBase in_RDI;
  EqMatcher<mp::StringLiteral> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<mp::StringLiteral>::MatcherBase((MatcherBase<mp::StringLiteral> *)0x15fcdc);
  *(undefined ***)in_RDI.impl_ = &PTR__Matcher_002a0aa8;
  this_00 = Eq<mp::StringLiteral>((StringLiteral)in_RDI.impl_);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=((Matcher<mp::StringLiteral> *)
            this_00.rhs_.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.
            impl_,(Matcher<mp::StringLiteral> *)in_RDI.impl_);
  ~Matcher((Matcher<mp::StringLiteral> *)0x15fd3a);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }